

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint RegNo;
  uint uVar5;
  DecodeStatus DVar6;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint size;
  uint align;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffb0;
  uint numBits;
  uint numBits_00;
  uint uVar7;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  DecodeStatus local_4;
  
  local_2c[0] = MCDisassembler_Success;
  numBits = 4;
  local_14 = in_ESI;
  local_10 = in_RDI;
  fieldFromInstruction_4(in_ESI,0xc,4);
  numBits_00 = 1;
  fieldFromInstruction_4(local_14,0x16,1);
  fieldFromInstruction_4(local_14,0x10,numBits);
  uVar2 = fieldFromInstruction_4(local_14,0,numBits);
  uVar3 = fieldFromInstruction_4(local_14,numBits,numBits_00);
  uVar4 = fieldFromInstruction_4(local_14,6,2);
  RegNo = numBits_00 << ((byte)uVar4 & 0x1f);
  uVar7 = RegNo * uVar3 * 2;
  uVar5 = MCInst_getOpcode(local_10);
  if (uVar5 - 0x3a4 < 3) {
LAB_002a22ac:
    DVar6 = DecodeDPairRegisterClass
                      ((MCInst *)CONCAT44(uVar2,uVar7),RegNo,CONCAT44(uVar5,numBits_00),
                       (void *)CONCAT44(numBits,in_stack_ffffffffffffffb0));
    _Var1 = Check(local_2c,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    if (2 < uVar5 - 0x3a7) {
      if (uVar5 - 0x3aa < 3) goto LAB_002a22ac;
      if (2 < uVar5 - 0x3ad) {
        if (uVar5 - 0x3b0 < 3) goto LAB_002a22ac;
        if (2 < uVar5 - 0x3b3) {
          DVar6 = DecodeDPRRegisterClass
                            ((MCInst *)CONCAT44(uVar2,uVar7),RegNo,CONCAT44(uVar5,numBits_00),
                             (void *)CONCAT44(numBits,in_stack_ffffffffffffffb0));
          _Var1 = Check(local_2c,DVar6);
          if (!_Var1) {
            return MCDisassembler_Fail;
          }
          goto LAB_002a2351;
        }
      }
    }
    DVar6 = DecodeDPairSpacedRegisterClass
                      ((MCInst *)CONCAT44(uVar2,uVar7),RegNo,CONCAT44(uVar5,numBits_00),
                       (void *)CONCAT44(numBits,in_stack_ffffffffffffffb0));
    _Var1 = Check(local_2c,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
LAB_002a2351:
  if (uVar2 != 0xf) {
    MCOperand_CreateImm0(local_10,0);
  }
  DVar6 = DecodeGPRRegisterClass
                    ((MCInst *)CONCAT44(uVar2,uVar7),RegNo,CONCAT44(uVar5,numBits_00),
                     (void *)CONCAT44(numBits,in_stack_ffffffffffffffb0));
  _Var1 = Check(local_2c,DVar6);
  if (_Var1) {
    MCOperand_CreateImm0(local_10,(ulong)uVar7);
    if ((uVar2 != 0xd) && (uVar2 != 0xf)) {
      DVar6 = DecodeGPRRegisterClass
                        ((MCInst *)CONCAT44(uVar2,uVar7),RegNo,CONCAT44(uVar5,numBits_00),
                         (void *)CONCAT44(numBits,in_stack_ffffffffffffffb0));
      _Var1 = Check(local_2c,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    local_4 = local_2c[0];
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, align, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	align = fieldFromInstruction_4(Insn, 4, 1);
	size = 1 << fieldFromInstruction_4(Insn, 6, 2);
	align *= 2*size;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD2DUPd16: case ARM_VLD2DUPd32: case ARM_VLD2DUPd8:
		case ARM_VLD2DUPd16wb_fixed: case ARM_VLD2DUPd16wb_register:
		case ARM_VLD2DUPd32wb_fixed: case ARM_VLD2DUPd32wb_register:
		case ARM_VLD2DUPd8wb_fixed: case ARM_VLD2DUPd8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2DUPd16x2: case ARM_VLD2DUPd32x2: case ARM_VLD2DUPd8x2:
		case ARM_VLD2DUPd16x2wb_fixed: case ARM_VLD2DUPd16x2wb_register:
		case ARM_VLD2DUPd32x2wb_fixed: case ARM_VLD2DUPd32x2wb_register:
		case ARM_VLD2DUPd8x2wb_fixed: case ARM_VLD2DUPd8x2wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
	}

	if (Rm != 0xF)
		MCOperand_CreateImm0(Inst, 0);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm != 0xD && Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}